

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerivedModule.h
# Opt level: O0

ResultType
Scine::Core::DerivedModule::detail::exec_if_impl<false>::
execute<boost::mpl::v_iter<boost::mpl::vector<sample_namespace::DummyModelA,sample_namespace::DummyModelB,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,1l>,boost::mpl::v_iter<boost::mpl::vector<sample_namespace::DummyModelA,sample_namespace::DummyModelB,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,2l>,Scine::Core::DerivedModule::detail::ModelTypeIdentifierMatches,Scine::Core::DerivedModule::detail::MatchFoundExecutor>
          (v_iter<boost::mpl::vector<sample_namespace::DummyModelA,_sample_namespace::DummyModelB,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_1L>
           *param_1,
          v_iter<boost::mpl::vector<sample_namespace::DummyModelA,_sample_namespace::DummyModelB,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_2L>
          *param_2,ModelTypeIdentifierMatches *p,MatchFoundExecutor *e)

{
  bool bVar1;
  MatchFoundExecutor *in_RCX;
  ModelTypeIdentifierMatches *in_RDX;
  v_iter<boost::mpl::vector<sample_namespace::DummyModelA,_sample_namespace::DummyModelB,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_2L>
  *in_RSI;
  v_iter<boost::mpl::vector<sample_namespace::DummyModelA,_sample_namespace::DummyModelB,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_2L>
  *in_RDI;
  DummyModelB *in_stack_00000028;
  ModelTypeIdentifierMatches *in_stack_00000030;
  undefined1 local_1;
  
  bVar1 = ModelTypeIdentifierMatches::operator()(in_stack_00000030,in_stack_00000028);
  if (bVar1) {
    local_1 = MatchFoundExecutor::operator()(in_RCX,(DummyModelB *)0x0);
  }
  else {
    local_1 = exec_if_impl<true>::
              execute<boost::mpl::v_iter<boost::mpl::vector<sample_namespace::DummyModelA,sample_namespace::DummyModelB,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,2l>,boost::mpl::v_iter<boost::mpl::vector<sample_namespace::DummyModelA,sample_namespace::DummyModelB,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,2l>,Scine::Core::DerivedModule::detail::ModelTypeIdentifierMatches,Scine::Core::DerivedModule::detail::MatchFoundExecutor>
                        (in_RDI,in_RSI,in_RDX,in_RCX);
  }
  return local_1;
}

Assistant:

static auto execute(Iter* /* i */, LastIter* /* l */, const Pred& p, const Exec& e) -> typename Exec::ResultType {
    using Item = typename boost::mpl::deref<Iter>::type;

    if (!p(static_cast<Item*>(0))) {
      using Next = typename boost::mpl::next<Iter>::type;
      return exec_if_impl<boost::is_same<Next, LastIter>::value>::execute(static_cast<Next*>(0),
                                                                          static_cast<LastIter*>(0), p, e);
    }

    return e(static_cast<Item*>(0));
  }